

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O3

int Super_CompareGates(Super_Man_t *pMan,uint *uTruth,float Area,float *tPinDelaysRes,int nPins)

{
  float fVar1;
  float fVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char **ppcVar9;
  int *piVar10;
  ulong uVar11;
  char *pEntry;
  uint uVar12;
  double dVar13;
  Super_Gate_t_conflict **ppList;
  char *local_58;
  char **local_50;
  int *local_48;
  double local_40;
  double local_38;
  
  uVar12 = *uTruth;
  if (pMan->nVarsMax < 6) {
    if (uVar12 + 1 < 2) {
      return 0;
    }
  }
  else if (uVar12 == 0xffffffff) {
    uVar12 = 0xffffffff;
    if (uTruth[1] == 0xffffffff) {
      return 0;
    }
  }
  else if ((uVar12 == 0) && (uVar12 = 0, uTruth[1] == 0)) {
    return 0;
  }
  iVar8 = stmm_find(pMan->tTable,(char *)(ulong)(uVar12 ^ uTruth[1]),&local_50);
  if ((iVar8 != 0) && (*local_50 != (char *)0x0)) {
    dVar13 = (double)Area;
    local_38 = dVar13 + 0.001;
    local_48 = &pMan->nRemoved;
    local_58 = (char *)0x0;
    pEntry = *local_50;
    local_40 = dVar13;
    do {
      pcVar3 = *(char **)(pEntry + 0x68);
      pMan->nLookups = pMan->nLookups + 1;
      piVar10 = &pMan->nAliases;
      if ((*(uint *)(pEntry + 0xc) == *uTruth) && (*(uint *)(pEntry + 0x10) == uTruth[1])) {
        if (dVar13 <= (double)*(float *)(pEntry + 0x48) + 0.001) {
          bVar4 = false;
          if ((double)*(float *)(pEntry + 0x48) <= local_38) goto LAB_003788d1;
          bVar6 = true;
        }
        else {
          bVar4 = true;
LAB_003788d1:
          bVar6 = false;
        }
        bVar5 = bVar4;
        bVar7 = bVar6;
        if (0 < nPins) {
          uVar11 = 0;
          do {
            fVar1 = *(float *)(pEntry + uVar11 * 4 + 0x4c);
            if ((fVar1 != -9999.0) || (NAN(fVar1))) {
              fVar2 = tPinDelaysRes[uVar11];
              if ((fVar2 != -9999.0) || (NAN(fVar2))) {
                if (fVar2 <= fVar1 + 0.001) {
                  if (fVar2 + 0.001 < fVar1) {
                    bVar6 = true;
                  }
                }
                else {
                  bVar4 = true;
                }
                bVar5 = true;
                bVar7 = true;
                if (bVar4 && bVar6) break;
              }
            }
            uVar11 = uVar11 + 1;
            bVar5 = bVar4;
            bVar7 = bVar6;
          } while ((uint)nPins != uVar11);
        }
        if (!bVar5 || !bVar7) {
          if (!bVar7) {
            return 0;
          }
          ppcVar9 = local_50;
          if (local_58 != (char *)0x0) {
            ppcVar9 = (char **)(local_58 + 0x68);
          }
          *ppcVar9 = *(char **)(pEntry + 0x68);
          Extra_MmFixedEntryRecycle(pMan->pMem,pEntry);
          piVar10 = local_48;
          dVar13 = local_40;
          goto LAB_003789b6;
        }
      }
      else {
LAB_003789b6:
        *piVar10 = *piVar10 + 1;
        pEntry = local_58;
      }
      local_58 = pEntry;
      pEntry = pcVar3;
    } while (pcVar3 != (char *)0x0);
  }
  return 1;
}

Assistant:

int Super_CompareGates( Super_Man_t * pMan, unsigned uTruth[], float Area, float tPinDelaysRes[], int nPins )
{
    Super_Gate_t ** ppList, * pPrev, * pGate, * pGate2;
    int i, fNewIsBetter, fGateIsBetter;
    ABC_PTRUINT_T Key;

    // skip constant functions
    if ( pMan->nVarsMax < 6 )
    {
        if ( uTruth[0] == 0 || ~uTruth[0] == 0 )
            return 0;
    }
    else
    {
        if ( ( uTruth[0] == 0 && uTruth[1] == 0 ) || ( ~uTruth[0] == 0 && ~uTruth[1] == 0 ) )
            return 0;
    }

    // get hold of the place where the entry is stored
//    Key = uTruth[0] + 2003 * uTruth[1];
    Key = uTruth[0] ^ uTruth[1];
    if ( !stmm_find( pMan->tTable, (char *)Key, (char ***)&ppList ) )
        return 1; 
    // the entry with this truth table is found
    pPrev = NULL;
    for ( pGate = *ppList, pGate2 = pGate? pGate->pNext: NULL; pGate; 
        pGate = pGate2, pGate2 = pGate? pGate->pNext: NULL )
    {
        pMan->nLookups++;
        if ( pGate->uTruth[0] != uTruth[0] || pGate->uTruth[1] != uTruth[1] )
        {
            pMan->nAliases++;
            continue;
        }
        fGateIsBetter = 0;
        fNewIsBetter  = 0;
        if ( pGate->Area + SUPER_EPSILON < Area )
            fGateIsBetter = 1;
        else if ( pGate->Area > Area + SUPER_EPSILON )
            fNewIsBetter = 1;
        for ( i = 0; i < nPins; i++ )
        {
            if ( pGate->ptDelays[i] == SUPER_NO_VAR || tPinDelaysRes[i] == SUPER_NO_VAR )
                continue;
            if ( pGate->ptDelays[i] + SUPER_EPSILON < tPinDelaysRes[i] )
                fGateIsBetter = 1;
            else if ( pGate->ptDelays[i] > tPinDelaysRes[i] + SUPER_EPSILON )
                fNewIsBetter = 1;
            if ( fGateIsBetter && fNewIsBetter )
                break;
        }
        // consider 4 cases
        if ( fGateIsBetter && fNewIsBetter ) // Pareto points; save both
            pPrev = pGate;
        else if ( fNewIsBetter ) // gate is worse; remove the gate
        {
            if ( pPrev == NULL )
                *ppList = pGate->pNext;
            else
                pPrev->pNext = pGate->pNext;
            Extra_MmFixedEntryRecycle( pMan->pMem, (char *)pGate );
            pMan->nRemoved++;
        }
        else if ( fGateIsBetter ) // new is worse, already dominated no need to see others
            return 0;
        else // if ( !fGateIsBetter && !fNewIsBetter ) // they are identical, no need to see others
            return 0;
    }
    return 1;
}